

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Vertex::smoothNeighborhood
          (Vertex *this,double diff,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *pmVar1;
  bool bVar2;
  reference ppVar3;
  pointer this_00;
  VertexIter *pVVar4;
  pointer pVVar5;
  double dVar6;
  double newDiff;
  double dist;
  VertexIter u;
  HalfedgeIter h;
  pair<const_std::_List_iterator<CMU462::Halfedge>,_double> hd;
  iterator __end1;
  iterator __begin1;
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *__range1;
  double local_30;
  int local_24;
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *pmStack_20;
  int depth_local;
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *seen_local;
  double diff_local;
  Vertex *this_local;
  
  local_30 = 0.0;
  local_24 = depth;
  pmStack_20 = seen;
  seen_local = (map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
                *)diff;
  diff_local = (double)this;
  std::
  map<std::_List_iterator<CMU462::Halfedge>,double,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
  ::emplace<std::_List_iterator<CMU462::Halfedge>&,double>
            ((map<std::_List_iterator<CMU462::Halfedge>,double,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
              *)seen,&this->_halfedge,&local_30);
  getNeighborhood(this,pmStack_20,local_24);
  pmVar1 = pmStack_20;
  __end1 = std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::begin(pmStack_20);
  hd.second = (double)std::
                      map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
                      ::end(pmVar1);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&hd.second);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>
             ::operator*(&__end1);
    u._M_node = (ppVar3->first)._M_node;
    hd.first._M_node = (_List_node_base *)ppVar3->second;
    this_00 = std::_List_iterator<CMU462::Halfedge>::operator->
                        ((_List_iterator<CMU462::Halfedge> *)&u);
    pVVar4 = Halfedge::vertex(this_00);
    pmVar1 = seen_local;
    dist = (double)pVVar4->_M_node;
    dVar6 = exp(-(double)hd.first._M_node * (double)hd.first._M_node * 2.0);
    pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)&dist);
    pVVar5->offset = (float)((double)pVVar5->offset + (double)pmVar1 * dVar6);
    std::_Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Vertex::smoothNeighborhood(double diff, map<HalfedgeIter, double>& seen, int depth) {

    seen.emplace(_halfedge, 0.0);

    getNeighborhood(seen, depth);

    for (auto hd : seen) {
      HalfedgeIter h = hd.first;
      VertexIter u = h->vertex();
      double dist = hd.second;
      double newDiff = diff*exp(-dist*dist *2.0);
      u->offset += newDiff;
    }
  }